

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int katherine_update_sensor_registers(katherine_device_t *device)

{
  int local_1c;
  int res;
  katherine_device_t *device_local;
  
  local_1c = katherine_udp_mutex_lock(&device->control_socket);
  if (((local_1c == 0) &&
      (local_1c = katherine_cmd_hw_sensor_config_registers_update(&device->control_socket),
      local_1c == 0)) && (local_1c = katherine_cmd_wait_ack(&device->control_socket), local_1c == 0)
     ) {
    katherine_udp_mutex_unlock(&device->control_socket);
    device_local._4_4_ = 0;
  }
  else {
    katherine_udp_mutex_unlock(&device->control_socket);
    device_local._4_4_ = local_1c;
  }
  return device_local._4_4_;
}

Assistant:

int
katherine_update_sensor_registers(katherine_device_t *device)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_hw_sensor_config_registers_update(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}